

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O0

BOOL RemoveDirectoryW(LPCWSTR lpPathName)

{
  SIZE_T count;
  size_t sVar1;
  char *lpMultiByteStr;
  long in_FS_OFFSET;
  char *mb_dir;
  size_t length;
  DWORD local_60;
  BOOL bRet;
  DWORD dwLastError;
  int mb_size;
  LPCWSTR lpPathName_local;
  PathCharString mb_dirPathString;
  
  mb_dirPathString.m_count = *(SIZE_T *)(in_FS_OFFSET + 0x28);
  _dwLastError = lpPathName;
  StackString<32UL,_char>::StackString((StackString<32UL,_char> *)&lpPathName_local);
  local_60 = 0;
  length._4_4_ = 0;
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  if (_dwLastError == (char16_t *)0x0) {
    local_60 = 3;
  }
  else {
    sVar1 = PAL_wcslen(_dwLastError);
    count = sVar1 * 3 + 3;
    lpMultiByteStr =
         StackString<32UL,_char>::OpenStringBuffer
                   ((StackString<32UL,_char> *)&lpPathName_local,count);
    if (lpMultiByteStr == (char *)0x0) {
      local_60 = 8;
    }
    else {
      mb_dir._0_4_ = (int)count;
      bRet = WideCharToMultiByte(0,0,_dwLastError,-1,lpMultiByteStr,(int)mb_dir,(LPCSTR)0x0,
                                 (LPBOOL)0x0);
      StackString<32UL,_char>::CloseBuffer((StackString<32UL,_char> *)&lpPathName_local,(long)bRet);
      if (bRet == 0) {
        local_60 = GetLastError();
        if (local_60 == 0x7a) {
          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
            abort();
          }
          local_60 = 0xce;
        }
        else {
          fprintf(_stderr,"] %s %s:%d","RemoveDirectoryW",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/directory.cpp"
                  ,0x121);
          fprintf(_stderr,"WideCharToMultiByte failure! error is %d\n",(ulong)local_60);
          local_60 = 0x54f;
        }
      }
      else {
        length._4_4_ = RemoveDirectoryHelper(lpMultiByteStr,&local_60);
        if ((length._4_4_ != 0) && ((PAL_InitializeChakraCoreCalled & 1U) == 0)) {
          abort();
        }
      }
    }
  }
  if (local_60 != 0) {
    SetLastError(local_60);
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  StackString<32UL,_char>::~StackString((StackString<32UL,_char> *)&lpPathName_local);
  if (*(SIZE_T *)(in_FS_OFFSET + 0x28) == mb_dirPathString.m_count) {
    return length._4_4_;
  }
  __stack_chk_fail();
}

Assistant:

BOOL
PALAPI
RemoveDirectoryW(
         IN LPCWSTR lpPathName)
{
    PathCharString mb_dirPathString;
    int   mb_size;
    DWORD dwLastError = 0;
    BOOL  bRet = FALSE;
    size_t length;
    char * mb_dir;

    PERF_ENTRY(RemoveDirectoryW);
    ENTRY("RemoveDirectoryW(lpPathName=%p (%S))\n",
          lpPathName?lpPathName:W16_NULLSTRING,
          lpPathName?lpPathName:W16_NULLSTRING);

    if (lpPathName == NULL) 
    {
        dwLastError = ERROR_PATH_NOT_FOUND;
        goto done;
    }

    length = (PAL_wcslen(lpPathName)+1) * 3;
    mb_dir = mb_dirPathString.OpenStringBuffer(length);
    if (NULL == mb_dir)
    {
        dwLastError = ERROR_NOT_ENOUGH_MEMORY;
        goto done;        
    }

    mb_size = WideCharToMultiByte( CP_ACP, 0, lpPathName, -1, mb_dir, length,
                                   NULL, NULL );
    mb_dirPathString.CloseBuffer(mb_size);

    if( mb_size == 0 )
    {
        dwLastError = GetLastError();
        if( dwLastError == ERROR_INSUFFICIENT_BUFFER )
        {
            WARN("lpPathName is larger than MAX_LONGPATH (%d)!\n", MAX_LONGPATH);
            dwLastError = ERROR_FILENAME_EXCED_RANGE;
        }
        else
        {
            ASSERT("WideCharToMultiByte failure! error is %d\n", dwLastError);
            dwLastError = ERROR_INTERNAL_ERROR;
        }
        goto done;
    }

    if ((bRet = RemoveDirectoryHelper (mb_dir, &dwLastError)))
    {
        TRACE("Removal of directory [%s] was successful.\n", mb_dir);
    }

done:
    if( dwLastError )
    {
        SetLastError( dwLastError );
    }

    LOGEXIT("RemoveDirectoryW returns BOOL %d\n", bRet);
    PERF_EXIT(RemoveDirectoryW);
    return bRet;
}